

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

array<int,_3UL> __thiscall PFData::unflattenIndex(PFData *this,int index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  PFData *in_RDI;
  array<int,_3UL> aVar4;
  int x;
  int y;
  int z;
  undefined4 local_c;
  undefined4 uStack_8;
  undefined4 local_4;
  
  iVar1 = getNZ(in_RDI);
  iVar2 = getNY(in_RDI);
  iVar3 = getNX(in_RDI);
  if ((in_ESI < iVar1 * iVar2 * iVar3) && (-1 < in_ESI)) {
    iVar1 = getNX(in_RDI);
    iVar2 = getNY(in_RDI);
    local_c = in_ESI / (iVar1 * iVar2);
    iVar1 = getNX(in_RDI);
    iVar2 = getNY(in_RDI);
    local_4 = in_ESI - local_c * iVar1 * iVar2;
    uStack_8 = getNX(in_RDI);
    uStack_8 = local_4 / uStack_8;
    iVar1 = getNX(in_RDI);
    local_4 = local_4 - uStack_8 * iVar1;
  }
  else {
    local_c = -1;
    uStack_8 = -1;
    local_4 = -1;
  }
  aVar4._M_elems[0] = local_c;
  aVar4._M_elems[1] = uStack_8;
  aVar4._M_elems[2] = local_4;
  return (array<int,_3UL>)aVar4._M_elems;
}

Assistant:

std::array<int, 3> PFData::unflattenIndex(int index) const{
    if(index >= getNZ() * getNY() * getNX() || index < 0){  //Invalid index, @@TODO assert instead?
        return {-1, -1, -1};
    }

    const int z = index / (getNX() * getNY());
    index -= z * getNX() * getNY();

    const int y = index / getNX();
    index -= y * getNX();

    const int x = index;    //index remainder is x value

    //Sanity check
    assert(z < getNZ() && z >= 0);
    assert(y < getNY() && y >= 0);
    assert(x < getNX() && x >= 0);

    return {z, y, x};
}